

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O3

void Assimp::FindMeshCenter(aiMesh *mesh,aiVector3D *out,aiVector3D *min,aiVector3D *max)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  aiVector3D *paVar6;
  undefined1 auVar7 [16];
  undefined8 uVar9;
  long lVar8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  float fVar16;
  
  paVar6 = mesh->mVertices;
  uVar5 = mesh->mNumVertices;
  max->x = -1e+10;
  max->y = -1e+10;
  max->z = -1e+10;
  min->x = 1e+10;
  min->y = 1e+10;
  min->z = 1e+10;
  if ((ulong)uVar5 == 0) {
    uVar9._0_4_ = max->x;
    uVar9._4_4_ = max->y;
    fVar13 = max->z;
    uVar15 = 0x501502f9501502f9;
    fVar14 = 1e+10;
  }
  else {
    lVar8 = 0;
    do {
      uVar1 = min->x;
      uVar3 = min->y;
      auVar10._4_4_ = uVar3;
      auVar10._0_4_ = uVar1;
      auVar10._8_8_ = 0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)((long)&paVar6->x + lVar8);
      auVar11 = minps(auVar10,auVar11);
      fVar14 = *(float *)((long)&paVar6->z + lVar8);
      fVar13 = min->z;
      if (fVar14 <= min->z) {
        fVar13 = fVar14;
      }
      min->x = (float)(int)auVar11._0_8_;
      min->y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
      min->z = fVar13;
      uVar2 = max->x;
      uVar4 = max->y;
      auVar12._4_4_ = uVar4;
      auVar12._0_4_ = uVar2;
      auVar12._8_8_ = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)((long)&paVar6->x + lVar8);
      auVar11 = maxps(auVar12,auVar7);
      uVar9 = auVar11._0_8_;
      fVar14 = *(float *)((long)&paVar6->z + lVar8);
      fVar13 = max->z;
      if (max->z <= fVar14) {
        fVar13 = fVar14;
      }
      max->x = (float)(int)uVar9;
      max->y = (float)(int)((ulong)uVar9 >> 0x20);
      max->z = fVar13;
      lVar8 = lVar8 + 0xc;
    } while ((ulong)uVar5 * 0xc != lVar8);
    uVar15._0_4_ = min->x;
    uVar15._4_4_ = min->y;
    fVar14 = min->z;
  }
  fVar16 = (float)((ulong)uVar15 >> 0x20);
  out->x = ((float)uVar9 - (float)uVar15) * 0.5 + (float)uVar15;
  out->y = ((float)((ulong)uVar9 >> 0x20) - fVar16) * 0.5 + fVar16;
  out->z = (fVar13 - fVar14) * 0.5 + fVar14;
  return;
}

Assistant:

void FindMeshCenter (aiMesh* mesh, aiVector3D& out, aiVector3D& min, aiVector3D& max)
{
    ArrayBounds(mesh->mVertices,mesh->mNumVertices, min,max);
    out = min + (max-min)*(ai_real)0.5;
}